

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateRationalLiteral(ExpressionTranslateContext *ctx,ExprRationalLiteral *expression)

{
  ExprRationalLiteral *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  if ((expression->super_ExprBase).type == ctx->ctx->typeFloat) {
    Print(ctx,"((float)%.9g)",expression->value);
  }
  else {
    if ((expression->super_ExprBase).type != ctx->ctx->typeDouble) {
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0x207,
                    "void TranslateRationalLiteral(ExpressionTranslateContext &, ExprRationalLiteral *)"
                   );
    }
    Print(ctx,"%.17g",expression->value);
  }
  return;
}

Assistant:

void TranslateRationalLiteral(ExpressionTranslateContext &ctx, ExprRationalLiteral *expression)
{
	if(expression->type == ctx.ctx.typeFloat)
		Print(ctx, "((float)%.9g)", expression->value);
	else if(expression->type == ctx.ctx.typeDouble)
		Print(ctx, "%.17g", expression->value);
	else
		assert(!"unknown type");
}